

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STDAllocator.hpp
# Opt level: O0

void __thiscall
Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
          (STDDeleter<void,_Diligent::IMemoryAllocator> *this,void *ptr)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  void *ptr_local;
  STDDeleter<void,_Diligent::IMemoryAllocator> *this_local;
  
  msg.field_2._8_8_ = ptr;
  if (this->m_Allocator == (IMemoryAllocator *)0x0) {
    FormatString<char[72]>
              ((string *)local_38,
               (char (*) [72])
               "The deleter has been moved away or never initialized, and can\'t be used");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/STDAllocator.hpp"
               ,0xd1);
    std::__cxx11::string::~string((string *)local_38);
  }
  Destruct<void>((void *)msg.field_2._8_8_);
  (*this->m_Allocator->_vptr_IMemoryAllocator[1])(this->m_Allocator,msg.field_2._8_8_);
  return;
}

Assistant:

void operator()(T* ptr) noexcept
    {
        VERIFY(m_Allocator != nullptr, "The deleter has been moved away or never initialized, and can't be used");
        Destruct(ptr);
        m_Allocator->Free(ptr);
    }